

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall libtorrent::aux::torrent::recalc_share_mode(torrent *this)

{
  pointer pppVar1;
  peer_connection *this_00;
  peer_connection **pppVar2;
  long *plVar3;
  undefined1 auVar4 [16];
  mutex_type *__first;
  peer_connection **__last;
  torrent *ptVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  mt19937 *__g;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int iVar9;
  piece_index_t index;
  int iVar10;
  peer_connection **__args;
  pointer pppVar11;
  long lVar12;
  piece_stats_t pVar13;
  vector<peer_connection_*> seeds;
  vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
  local_78;
  int local_5c;
  torrent *local_58;
  int local_4c;
  undefined1 local_48 [8];
  undefined1 local_40;
  undefined7 uStack_3f;
  
  bVar6 = is_seed(this);
  if (!bVar6) {
    pppVar11 = (this->super_torrent_hot_members).m_connections.
               super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
               .
               super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    pppVar1 = (this->super_torrent_hot_members).m_connections.
              super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              .
              super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (pppVar11 != pppVar1) {
      local_58 = (torrent *)
                 CONCAT44(local_58._4_4_,
                          (((this->super_torrent_hot_members).m_torrent_file.
                            super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->m_files).m_num_pieces);
      iVar10 = 0;
      iVar9 = 0;
      local_4c = 0;
      local_5c = 0;
      do {
        this_00 = *pppVar11;
        if ((((this_00->super_peer_connection_hot_members).field_0x28 & 2) == 0) &&
           (iVar7 = (*(this_00->super_bandwidth_socket)._vptr_bandwidth_socket[1])(this_00),
           (char)iVar7 == '\0')) {
          iVar9 = iVar9 + 1;
          bVar6 = peer_connection::is_seed(this_00);
          if (bVar6) {
            iVar10 = iVar10 + 1;
          }
          else if ((((this_00->field_0x886 & 6) == 0) &&
                   (bVar6 = peer_connection::is_seed(this_00), !bVar6)) &&
                  ((this_00->field_0x887 & 1) == 0)) {
            local_4c = local_4c + 1;
            local_5c = (local_5c + (int)local_58) - this_00->m_num_pieces;
          }
        }
        pppVar11 = pppVar11 + 1;
      } while (pppVar11 != pppVar1);
      if (iVar9 != 0) {
        local_58 = this;
        if ((0x32 < (iVar10 * 100) / iVar9) &&
           (0x5a < (iVar9 * 100) /
                   (int)((uint)((ulong)*(undefined8 *)&(this->super_torrent_hot_members).field_0x48
                               >> 0x21) & 0xffffff) || 0x14 < iVar9)) {
          local_78.
          super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_78.
          super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = (peer_connection **)0x0;
          local_78.
          super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (peer_connection **)0x0;
          ::std::
          vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
          ::reserve(&local_78,(long)iVar10);
          pppVar2 = (local_58->super_torrent_hot_members).m_connections.
                    super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                    .
                    super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          __first = (mutex_type *)
                    local_78.
                    super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          __last = local_78.
                   super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (__args = (local_58->super_torrent_hot_members).m_connections.
                        super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                        .
                        super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_78.
              super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)__first,
              local_78.
              super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              ._M_impl.super__Vector_impl_data._M_finish = __last, __args != pppVar2;
              __args = __args + 1) {
            bVar6 = peer_connection::is_seed(*__args);
            if (bVar6) {
              if (local_78.
                  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  local_78.
                  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                ::std::
                vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>
                ::_M_realloc_insert<libtorrent::aux::peer_connection*const&>
                          ((vector<libtorrent::aux::peer_connection*,std::allocator<libtorrent::aux::peer_connection*>>
                            *)&local_78,
                           (iterator)
                           local_78.
                           super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish,__args);
              }
              else {
                *local_78.
                 super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish = *__args;
                local_78.
                super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_78.
                     super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
              }
            }
            __first = (mutex_type *)
                      local_78.
                      super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            __last = local_78.
                     super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          }
          __g = random_engine();
          ::std::
          shuffle<libtorrent::aux::peer_connection**,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
                    ((peer_connection **)__first,__last,__g);
          pppVar11 = local_78.
                     super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          iVar7 = iVar10 - iVar9 / 2;
          if (iVar7 != 0) {
            lVar12 = 0;
            do {
              plVar3 = *(long **)((long)&((__mutex_base *)pppVar11)->_M_mutex + lVar12);
              _local_48 = errors::make_error_code(upload_upload_connection);
              (**(code **)(*plVar3 + 0xa0))(plVar3,local_48,1,0);
              lVar12 = lVar12 + 8;
            } while ((long)iVar7 * 8 != lVar12);
          }
          if ((mutex_type *)
              local_78.
              super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              ._M_impl.super__Vector_impl_data._M_start != (mutex_type *)0x0) {
            operator_delete(local_78.
                            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_78.
                                  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_78.
                                  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
        }
        ptVar5 = local_58;
        if ((local_4c != 0) && (iVar10 * 2 < local_5c)) {
          piece_picker::have((local_58->super_torrent_hot_members).m_picker._M_t.
                             super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                             .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                             _M_head_impl);
          piece_picker::want((piece_count *)local_48,
                             (ptVar5->super_torrent_hot_members).m_picker._M_t.
                             super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                             .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                             _M_head_impl);
          iVar10 = local_48._0_4_;
          if ((int)local_48._0_4_ <
              (int)local_78.
                   super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                   ._M_impl.super__Vector_impl_data._M_start) {
            iVar10 = (int)local_78.
                          super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                          ._M_impl.super__Vector_impl_data._M_start;
          }
          iVar7 = (((ptVar5->super_torrent_hot_members).m_torrent_file.
                    super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->m_files).m_piece_length;
          iVar8 = (*(((ptVar5->super_torrent_hot_members).m_ses)->super_session_logger).
                    _vptr_session_logger[0x2e])();
          local_78.
          super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)(CONCAT44(extraout_var,iVar8) + 0x438);
          local_78.
          super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)((ulong)local_78.
                                super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
          ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_78);
          local_78.
          super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (pointer)CONCAT71(local_78.
                                 super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._1_7_,1);
          lVar12 = (long)*(int *)(CONCAT44(extraout_var,iVar8) + 0x2dc) * (long)iVar7 * (long)iVar10
          ;
          ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_78);
          if (((lVar12 - ptVar5->m_total_uploaded == 0 || lVar12 < ptVar5->m_total_uploaded) ||
               iVar10 < 1) &&
             (iVar7 = piece_picker::get_download_queue_size
                                ((ptVar5->super_torrent_hot_members).m_picker._M_t.
                                 super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                                 .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                                 _M_head_impl), iVar7 <= iVar10 / 0x14)) {
            local_78.
            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_78.
            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_78.
            super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            iVar10 = (((ptVar5->super_torrent_hot_members).m_torrent_file.
                       super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->m_files).m_num_pieces;
            auVar4._12_4_ = 0;
            auVar4._0_12_ = stack0xffffffffffffffbc;
            _local_48 = (error_code)(auVar4 << 0x20);
            if (iVar10 < 1) {
              iVar7 = 0x7fffffff;
            }
            else {
              index.m_val = 0;
              iVar7 = 0x7fffffff;
              do {
                pVar13 = piece_picker::piece_stats
                                   ((ptVar5->super_torrent_hot_members).m_picker._M_t.
                                    super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                                    .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                                    _M_head_impl,index);
                iVar8 = pVar13.peer_count;
                if (iVar8 != 0) {
                  if ((pVar13._0_8_ >> 0x20 == 0) &&
                     (((pVar13._8_4_ >> 8 & 1) == 0 & (pVar13.have ^ 1U)) == 0)) {
                    piece_picker::set_piece_priority
                              ((ptVar5->super_torrent_hot_members).m_picker._M_t.
                               super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                               .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                               _M_head_impl,(piece_index_t)local_48._0_4_,(download_priority_t)0x4);
                  }
                  else if ((iVar8 <= iVar7 &&
                           ((undefined1  [12])pVar13 & (undefined1  [12])0x1) ==
                           (undefined1  [12])0x0) && pVar13.priority < 1) {
                    if (iVar7 == iVar8) {
                      if (local_78.
                          super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish ==
                          local_78.
                          super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                        ::std::
                        vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>
                        ::
                        _M_realloc_insert<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&>
                                  ((vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>
                                    *)&local_78,
                                   (iterator)
                                   local_78.
                                   super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,
                                   (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                                   local_48);
                      }
                      else {
                        *(int *)local_78.
                                super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish = local_48._0_4_;
                        iVar8 = iVar7;
LAB_0031bc78:
                        local_78.
                        super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish =
                             (pointer)((long)local_78.
                                             super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                             ._M_impl.super__Vector_impl_data._M_finish + 4);
                        iVar7 = iVar8;
                      }
                    }
                    else {
                      if (local_78.
                          super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish !=
                          local_78.
                          super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                          ._M_impl.super__Vector_impl_data._M_start) {
                        local_78.
                        super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish =
                             local_78.
                             super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                      }
                      if (local_78.
                          super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish !=
                          local_78.
                          super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                        *(int *)local_78.
                                super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish = local_48._0_4_;
                        goto LAB_0031bc78;
                      }
                      ::std::
                      vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>
                      ::
                      _M_realloc_insert<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&>
                                ((vector<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::allocator<libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>>>
                                  *)&local_78,
                                 (iterator)
                                 local_78.
                                 super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish,
                                 (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                                 local_48);
                      iVar7 = iVar8;
                    }
                  }
                }
                index.m_val = local_48._0_4_ + 1;
                local_48._0_4_ = index.m_val;
              } while (index.m_val < iVar10);
            }
            update_gauge(ptVar5);
            update_want_peers(ptVar5);
            iVar10 = (*(((ptVar5->super_torrent_hot_members).m_ses)->super_session_logger).
                       _vptr_session_logger[0x2e])();
            local_40 = false;
            local_48 = (undefined1  [8])(CONCAT44(extraout_var_00,iVar10) + 0x438);
            ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_48);
            local_40 = true;
            iVar10 = *(int *)(CONCAT44(extraout_var_00,iVar10) + 0x2dc);
            ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_48);
            ptVar5 = local_58;
            if (iVar10 <= iVar9 - iVar7) {
              lVar12 = random((aux *)(ulong)((int)((ulong)((long)local_78.
                                                  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)local_78.
                                                  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2) -
                                            1));
              bVar6 = is_finished(ptVar5);
              piece_picker::set_piece_priority
                        ((ptVar5->super_torrent_hot_members).m_picker._M_t.
                         super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                         .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl
                         ,(piece_index_t)
                          *(int *)((long)&((__mutex_base *)
                                          local_78.
                                          super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_mutex +
                                  (long)(int)lVar12 * 4),(download_priority_t)0x4);
              update_gauge(ptVar5);
              update_peer_interest(ptVar5,bVar6);
              update_want_peers(ptVar5);
            }
            if ((mutex_type *)
                local_78.
                super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                ._M_impl.super__Vector_impl_data._M_start != (mutex_type *)0x0) {
              operator_delete(local_78.
                              super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_78.
                                    super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_78.
                                    super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void torrent::recalc_share_mode()
	{
		TORRENT_ASSERT(share_mode());
		if (is_seed()) return;

		int const pieces_in_torrent = m_torrent_file->num_pieces();
		int num_seeds = 0;
		int num_peers = 0;
		int num_downloaders = 0;
		int missing_pieces = 0;
		for (auto const* const p : m_connections)
		{
			TORRENT_INCREMENT(m_iterating_connections);
			if (p->is_connecting()) continue;
			if (p->is_disconnecting()) continue;
			++num_peers;
			if (p->is_seed())
			{
				++num_seeds;
				continue;
			}

			if (p->share_mode()) continue;
			if (p->upload_only()) continue;

			++num_downloaders;
			missing_pieces += pieces_in_torrent - p->num_have_pieces();
		}

		if (num_peers == 0) return;

		if (num_seeds * 100 / num_peers > 50
			&& (num_peers * 100 / m_max_connections > 90
				|| num_peers > 20))
		{
			// we are connected to more than 50% seeds (and we're beyond
			// 90% of the max number of connections). That will
			// limit our ability to upload. We need more downloaders.
			// disconnect some seeds so that we don't have more than 50%
			int const to_disconnect = num_seeds - num_peers / 2;
			aux::vector<peer_connection*> seeds;
			seeds.reserve(num_seeds);
			std::copy_if(m_connections.begin(), m_connections.end(), std::back_inserter(seeds)
				, [](peer_connection const* p) { return p->is_seed(); });

			aux::random_shuffle(seeds);
			TORRENT_ASSERT(to_disconnect <= seeds.end_index());
			for (auto const& p : span<peer_connection*>(seeds).first(to_disconnect))
				p->disconnect(errors::upload_upload_connection, operation_t::bittorrent);
		}

		if (num_downloaders == 0) return;

		// assume that the seeds are about as fast as us. During the time
		// we can download one piece, and upload one piece, each seed
		// can upload two pieces.
		missing_pieces -= 2 * num_seeds;

		if (missing_pieces <= 0) return;

		// missing_pieces represents our opportunity to download pieces
		// and share them more than once each

		// now, download at least one piece, otherwise download one more
		// piece if our downloaded (and downloading) pieces is less than 50%
		// of the uploaded bytes
		int const num_downloaded_pieces = std::max(m_picker->have().num_pieces
			, m_picker->want().num_pieces);

		if (std::int64_t(num_downloaded_pieces) * m_torrent_file->piece_length()
			* settings().get_int(settings_pack::share_mode_target) > m_total_uploaded
			&& num_downloaded_pieces > 0)
			return;

		// don't have more pieces downloading in parallel than 5% of the total
		// number of pieces we have downloaded
		if (m_picker->get_download_queue_size() > num_downloaded_pieces / 20)
			return;

		// one more important property is that there are enough pieces
		// that more than one peer wants to download
		// make sure that there are enough downloaders for the rarest
		// piece. Go through all pieces, figure out which one is the rarest
		// and how many peers that has that piece

		aux::vector<piece_index_t> rarest_pieces;

		int const num_pieces = m_torrent_file->num_pieces();
		int rarest_rarity = INT_MAX;
		for (piece_index_t i(0); i < piece_index_t(num_pieces); ++i)
		{
			piece_picker::piece_stats_t ps = m_picker->piece_stats(i);
			if (ps.peer_count == 0) continue;
			if (ps.priority == 0 && (ps.have || ps.downloading))
			{
				m_picker->set_piece_priority(i, default_priority);
				continue;
			}
			// don't count pieces we already have or are trying to download
			if (ps.priority > 0 || ps.have) continue;
			if (ps.peer_count > rarest_rarity) continue;
			if (ps.peer_count == rarest_rarity)
			{
				rarest_pieces.push_back(i);
				continue;
			}

			rarest_pieces.clear();
			rarest_rarity = ps.peer_count;
			rarest_pieces.push_back(i);
		}

		update_gauge();
		update_want_peers();

		// now, rarest_pieces is a list of all pieces that are the rarest ones.
		// and rarest_rarity is the number of peers that have the rarest pieces

		// if there's only a single peer that doesn't have the rarest piece
		// it's impossible for us to download one piece and upload it
		// twice. i.e. we cannot get a positive share ratio
		if (num_peers - rarest_rarity
			< settings().get_int(settings_pack::share_mode_target))
			return;

		// now, pick one of the rarest pieces to download
		int const pick = int(random(aux::numeric_cast<std::uint32_t>(rarest_pieces.end_index() - 1)));
		bool const was_finished = is_finished();
		m_picker->set_piece_priority(rarest_pieces[pick], default_priority);
		update_gauge();
		update_peer_interest(was_finished);
		update_want_peers();
	}